

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O2

void __thiscall HEkkPrimal::phase1ChooseRow(HEkkPrimal *this)

{
  double dVar1;
  int iVar2;
  HEkk *pHVar3;
  pointer ppVar4;
  pointer pdVar5;
  long lVar6;
  pointer ppVar7;
  HighsInt i;
  long lVar8;
  int *piVar9;
  pointer ppVar10;
  long lVar11;
  uint uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  pair<double,_int> local_88;
  double local_78;
  double local_70;
  vector<std::pair<double,int>,std::allocator<std::pair<double,int>>> *local_68;
  vector<std::pair<double,int>,std::allocator<std::pair<double,int>>> *local_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  pHVar3 = this->ekk_instance_;
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x27,0);
  iVar2 = (pHVar3->info_).update_count;
  if (iVar2 < 10) {
    local_58 = 1e-09;
  }
  else {
    local_58 = *(double *)(&DAT_003b0f10 + (ulong)(iVar2 < 0x14) * 8);
  }
  uStack_50 = 0;
  ppVar4 = (this->ph1SorterR).
           super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->ph1SorterR).
      super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVar4) {
    (this->ph1SorterR).
    super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVar4;
  }
  ppVar4 = (this->ph1SorterT).
           super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->ph1SorterT).
      super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVar4) {
    (this->ph1SorterT).
    super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVar4;
  }
  local_60 = (vector<std::pair<double,int>,std::allocator<std::pair<double,int>>> *)
             &this->ph1SorterR;
  local_68 = (vector<std::pair<double,int>,std::allocator<std::pair<double,int>>> *)
             &this->ph1SorterT;
  local_48 = -local_58;
  uStack_40 = 0x8000000000000000;
  for (lVar8 = 0; lVar8 < (this->col_aq).count; lVar8 = lVar8 + 1) {
    iVar2 = (this->col_aq).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar8];
    dVar15 = (double)this->move_in *
             (this->col_aq).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[iVar2];
    if (local_58 < dVar15) {
      dVar14 = (pHVar3->info_).baseValue_.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start[iVar2];
      dVar1 = (pHVar3->info_).baseUpper_.super__Vector_base<double,_std::allocator<double>_>._M_impl
              .super__Vector_impl_data._M_start[iVar2];
      dVar13 = this->primal_feasibility_tolerance;
      local_70 = dVar15;
      if (dVar1 + dVar13 < dVar14) {
        local_88.first = ((dVar14 - dVar1) - dVar13) / dVar15;
        local_88.second = iVar2;
        local_78 = local_88.first;
        std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>::
        emplace_back<std::pair<double,int>>(local_60,&local_88);
        local_88.first = local_78;
        local_88.second = iVar2;
        std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>::
        emplace_back<std::pair<double,int>>(local_68,&local_88);
        dVar14 = (pHVar3->info_).baseValue_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[iVar2];
        dVar13 = this->primal_feasibility_tolerance;
      }
      dVar1 = (pHVar3->info_).baseLower_.super__Vector_base<double,_std::allocator<double>_>._M_impl
              .super__Vector_impl_data._M_start[iVar2];
      dVar15 = local_70;
      if ((dVar1 != -INFINITY) && (dVar1 - dVar13 < dVar14)) {
        local_88.first = (dVar13 + (dVar14 - dVar1)) / local_70;
        local_78 = (dVar14 - dVar1) / local_70;
        local_88.second = iVar2 - this->num_row;
        std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>::
        emplace_back<std::pair<double,int>>(local_60,&local_88);
        local_88.second = iVar2 - this->num_row;
        local_88.first = local_78;
        std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>::
        emplace_back<std::pair<double,int>>(local_68,&local_88);
        dVar15 = local_70;
      }
    }
    if (dVar15 < local_48) {
      dVar14 = (pHVar3->info_).baseValue_.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start[iVar2];
      dVar1 = (pHVar3->info_).baseLower_.super__Vector_base<double,_std::allocator<double>_>._M_impl
              .super__Vector_impl_data._M_start[iVar2];
      dVar13 = this->primal_feasibility_tolerance;
      if (dVar14 < dVar1 - dVar13) {
        local_88.first = ((dVar14 - dVar1) + dVar13) / dVar15;
        local_88.second = iVar2 - this->num_row;
        local_78 = local_88.first;
        local_70 = dVar15;
        std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>::
        emplace_back<std::pair<double,int>>(local_60,&local_88);
        local_88.second = iVar2 - this->num_row;
        local_88.first = local_78;
        std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>::
        emplace_back<std::pair<double,int>>(local_68,&local_88);
        dVar14 = (pHVar3->info_).baseValue_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[iVar2];
        dVar13 = this->primal_feasibility_tolerance;
        dVar15 = local_70;
      }
      dVar1 = (pHVar3->info_).baseUpper_.super__Vector_base<double,_std::allocator<double>_>._M_impl
              .super__Vector_impl_data._M_start[iVar2];
      if ((dVar1 != INFINITY) && (dVar14 < dVar1 + dVar13)) {
        local_88.first = ((dVar14 - dVar1) - dVar13) / dVar15;
        local_78 = (dVar14 - dVar1) / dVar15;
        local_88.second = iVar2;
        std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>::
        emplace_back<std::pair<double,int>>(local_60,&local_88);
        local_88.first = local_78;
        local_88.second = iVar2;
        std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>::
        emplace_back<std::pair<double,int>>(local_68,&local_88);
      }
    }
  }
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x27,0);
  if ((this->ph1SorterR).
      super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->ph1SorterR).
      super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this->row_out = -1;
    this->variable_out = -1;
  }
  else {
    HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x28,0);
    pdqsort<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::less<std::pair<double,int>>>
              ((this->ph1SorterR).
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
               (this->ph1SorterR).
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    ppVar4 = (this->ph1SorterR).
             super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    dVar15 = ABS(this->theta_dual);
    lVar8 = ((long)(this->ph1SorterR).
                   super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar4 >> 4) + 1;
    ppVar7 = ppVar4;
    do {
      ppVar10 = ppVar7;
      ppVar7 = ppVar4;
      lVar8 = lVar8 + -1;
      if (lVar8 == 0) break;
      dVar15 = dVar15 - ABS((this->col_aq).array.super__Vector_base<double,_std::allocator<double>_>
                            ._M_impl.super__Vector_impl_data._M_start
                            [(ppVar7->second >> 0x1f & this->num_row) + ppVar7->second]);
      ppVar4 = ppVar7 + 1;
    } while (0.0 < dVar15);
    local_70 = ppVar10->first;
    pdqsort<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::less<std::pair<double,int>>>
              ((this->ph1SorterT).
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
               (this->ph1SorterT).
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    ppVar4 = (this->ph1SorterT).
             super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar8 = (long)(this->ph1SorterT).
                  super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar4 >> 4;
    pdVar5 = (this->col_aq).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar15 = 0.0;
    lVar11 = 0;
    for (piVar9 = &ppVar4->second;
        (lVar6 = lVar8, lVar8 != lVar11 &&
        (lVar6 = lVar11, ((pair<double,_int> *)(piVar9 + -2))->first <= local_70));
        piVar9 = piVar9 + 4) {
      dVar14 = ABS(pdVar5[(*piVar9 >> 0x1f & this->num_row) + *piVar9]);
      if (dVar14 <= dVar15) {
        dVar14 = dVar15;
      }
      dVar15 = dVar14;
      lVar11 = lVar11 + 1;
    }
    this->row_out = -1;
    this->variable_out = -1;
    this->move_out = 0;
    piVar9 = &ppVar4[lVar6 + -1].second;
    lVar6 = lVar6 + 1;
    do {
      lVar6 = lVar6 + -1;
      if (lVar6 == 0) goto LAB_00345f87;
      iVar2 = *piVar9;
      piVar9 = piVar9 + -4;
      uVar12 = this->num_row;
      if (-1 < iVar2) {
        uVar12 = 0;
      }
    } while (ABS(pdVar5[(int)(uVar12 + iVar2)]) <= dVar15 * 0.1);
    this->row_out = uVar12 + iVar2;
    this->move_out = iVar2 >> 0x1f | 1;
LAB_00345f87:
    HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x28,0);
  }
  return;
}

Assistant:

void HEkkPrimal::phase1ChooseRow() {
  const HighsSimplexInfo& info = ekk_instance_.info_;
  const vector<double>& baseLower = info.baseLower_;
  const vector<double>& baseUpper = info.baseUpper_;
  const vector<double>& baseValue = info.baseValue_;
  analysis->simplexTimerStart(Chuzr1Clock);
  // Collect phase 1 theta lists
  //

  const double dPivotTol = info.update_count < 10   ? 1e-9
                           : info.update_count < 20 ? 1e-8
                                                    : 1e-7;
  ph1SorterR.clear();
  ph1SorterT.clear();
  for (HighsInt i = 0; i < col_aq.count; i++) {
    HighsInt iRow = col_aq.index[i];
    double dAlpha = col_aq.array[iRow] * move_in;

    // When the basic variable x[i] decrease
    if (dAlpha > +dPivotTol) {
      // Whether it can become feasible by going below its upper bound
      if (baseValue[iRow] > baseUpper[iRow] + primal_feasibility_tolerance) {
        double dFeasTheta =
            (baseValue[iRow] - baseUpper[iRow] - primal_feasibility_tolerance) /
            dAlpha;
        ph1SorterR.push_back(std::make_pair(dFeasTheta, iRow));
        ph1SorterT.push_back(std::make_pair(dFeasTheta, iRow));
      }
      // Whether it can become infeasible (again) by going below its
      // lower bound
      if (baseValue[iRow] > baseLower[iRow] - primal_feasibility_tolerance &&
          baseLower[iRow] > -kHighsInf) {
        double dRelaxTheta =
            (baseValue[iRow] - baseLower[iRow] + primal_feasibility_tolerance) /
            dAlpha;
        double dTightTheta = (baseValue[iRow] - baseLower[iRow]) / dAlpha;
        ph1SorterR.push_back(std::make_pair(dRelaxTheta, iRow - num_row));
        ph1SorterT.push_back(std::make_pair(dTightTheta, iRow - num_row));
      }
    }

    // When the basic variable x[i] increase
    if (dAlpha < -dPivotTol) {
      // Whether it can become feasible by going above its lower bound
      if (baseValue[iRow] < baseLower[iRow] - primal_feasibility_tolerance) {
        double dFeasTheta =
            (baseValue[iRow] - baseLower[iRow] + primal_feasibility_tolerance) /
            dAlpha;
        ph1SorterR.push_back(std::make_pair(dFeasTheta, iRow - num_row));
        ph1SorterT.push_back(std::make_pair(dFeasTheta, iRow - num_row));
      }
      // Whether it can become infeasible (again) by going above its
      // upper bound
      if (baseValue[iRow] < baseUpper[iRow] + primal_feasibility_tolerance &&
          baseUpper[iRow] < +kHighsInf) {
        double dRelaxTheta =
            (baseValue[iRow] - baseUpper[iRow] - primal_feasibility_tolerance) /
            dAlpha;
        double dTightTheta = (baseValue[iRow] - baseUpper[iRow]) / dAlpha;
        ph1SorterR.push_back(std::make_pair(dRelaxTheta, iRow));
        ph1SorterT.push_back(std::make_pair(dTightTheta, iRow));
      }
    }
  }

  analysis->simplexTimerStop(Chuzr1Clock);
  // When there are no candidates at all, we can leave it here
  if (ph1SorterR.empty()) {
    row_out = kNoRowChosen;
    variable_out = -1;
    return;
  }

  // Now sort the relaxed theta to find the final break point. TODO:
  // Consider partial sort. Or heapify [O(n)] and then pop k points
  // [kO(log(n))].

  analysis->simplexTimerStart(Chuzr2Clock);
  pdqsort(ph1SorterR.begin(), ph1SorterR.end());
  double dMaxTheta = ph1SorterR[0].first;
  double dGradient = fabs(theta_dual);
  for (size_t i = 0; i < ph1SorterR.size(); i++) {
    double dMyTheta = ph1SorterR[i].first;
    HighsInt index = ph1SorterR[i].second;
    HighsInt iRow = index >= 0 ? index : index + num_row;
    dGradient -= fabs(col_aq.array[iRow]);
    // Stop when the gradient start to decrease
    if (dGradient <= 0) {
      break;
    }
    dMaxTheta = dMyTheta;
  }

  // Find out the biggest possible alpha for pivot
  pdqsort(ph1SorterT.begin(), ph1SorterT.end());
  double dMaxAlpha = 0.0;
  size_t iLast = ph1SorterT.size();
  for (size_t i = 0; i < ph1SorterT.size(); i++) {
    double dMyTheta = ph1SorterT[i].first;
    HighsInt index = ph1SorterT[i].second;
    HighsInt iRow = index >= 0 ? index : index + num_row;
    double dAbsAlpha = fabs(col_aq.array[iRow]);
    // Stop when the theta is too large
    if (dMyTheta > dMaxTheta) {
      iLast = i;
      break;
    }
    // Update the maximal possible alpha
    if (dMaxAlpha < dAbsAlpha) {
      dMaxAlpha = dAbsAlpha;
    }
  }

  // Finally choose a pivot with good enough alpha, working backwards
  row_out = kNoRowChosen;
  variable_out = -1;
  move_out = 0;
  for (size_t i = iLast; i > 0; i--) {
    HighsInt index = ph1SorterT[i - 1].second;
    HighsInt iRow = index >= 0 ? index : index + num_row;
    double dAbsAlpha = fabs(col_aq.array[iRow]);
    if (dAbsAlpha > dMaxAlpha * 0.1) {
      row_out = iRow;
      move_out = index >= 0 ? 1 : -1;
      break;
    }
  }
  analysis->simplexTimerStop(Chuzr2Clock);
}